

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipFieldMessage(ParserImpl *this)

{
  bool bVar1;
  byte local_b1;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  undefined4 local_48;
  undefined1 local_38 [8];
  string delimiter;
  ParserImpl *this_local;
  
  delimiter.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_38);
  bVar1 = ConsumeMessageDelimiter(this,(string *)local_38);
  if (bVar1) {
    do {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_68,">",&local_69);
      bVar1 = LookingAt(this,&local_68);
      local_b1 = 0;
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_90,"}",&local_91);
        bVar1 = LookingAt(this,&local_90);
        local_b1 = bVar1 ^ 0xff;
        std::__cxx11::string::~string((string *)&local_90);
        std::allocator<char>::~allocator((allocator<char> *)&local_91);
      }
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
      if ((local_b1 & 1) == 0) {
        bVar1 = Consume(this,(string *)local_38);
        if (bVar1) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
        goto LAB_005a2643;
      }
      bVar1 = SkipField(this);
    } while (bVar1);
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = false;
  }
LAB_005a2643:
  local_48 = 1;
  std::__cxx11::string::~string((string *)local_38);
  return this_local._7_1_;
}

Assistant:

bool SkipFieldMessage() {
    string delimiter;
    DO(ConsumeMessageDelimiter(&delimiter));
    while (!LookingAt(">") &&  !LookingAt("}")) {
      DO(SkipField());
    }
    DO(Consume(delimiter));
    return true;
  }